

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O1

void __thiscall
llama_sbatch::add_seq_to_ubatch
          (llama_sbatch *this,llama_ubatch *ubatch,llama_sbatch_seq *seq,size_t length)

{
  char cVar1;
  llama_batch *plVar2;
  pointer plVar3;
  llama_token *plVar4;
  llama_pos *plVar5;
  llama_pos *plVar6;
  llama_seq_id **pplVar7;
  iterator iVar8;
  int8_t *piVar9;
  uint32_t uVar10;
  float *pfVar11;
  char *pcVar12;
  uint32_t uVar13;
  llama_token *plVar14;
  int32_t *piVar15;
  long lVar16;
  undefined8 uVar17;
  size_t sVar18;
  size_t sVar19;
  uint32_t uVar20;
  bool bVar21;
  long local_40;
  vector<long,std::allocator<long>> *local_38;
  
  plVar2 = this->batch;
  if (plVar2 == (llama_batch *)0x0) {
    pcVar12 = "batch != nullptr";
    uVar17 = 0x27;
    goto LAB_00186436;
  }
  if (seq->length < length) {
    pcVar12 = "length <= seq.length";
    uVar17 = 0x28;
    goto LAB_00186436;
  }
  if (((seq->n_seq_id != 0) && (ubatch->n_seqs != 0)) &&
     ((ulong)ubatch->n_tokens / (ulong)ubatch->n_seqs != length)) {
    pcVar12 = 
    "seq.n_seq_id == 0 || ubatch.n_seqs == 0 || length == (size_t) ubatch.n_tokens / ubatch.n_seqs";
    uVar17 = 0x2b;
    goto LAB_00186436;
  }
  bVar21 = ubatch->equal_seqs;
  if (bVar21 != (seq->n_seq_id != 0)) {
    pcVar12 = "(seq.n_seq_id != 0) == ubatch.equal_seqs";
    uVar17 = 0x2c;
    goto LAB_00186436;
  }
  plVar14 = plVar2->token;
  if (plVar14 == (llama_token *)0x0) {
    plVar14 = (llama_token *)0x0;
LAB_0018603a:
    ubatch->token = plVar14;
  }
  else {
    if (bVar21 == false) {
      plVar14 = plVar14 + seq->offset;
      goto LAB_0018603a;
    }
    if (length != 0) {
      sVar19 = seq->offset;
      plVar3 = (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar4 = ubatch->token;
      sVar18 = 0;
      do {
        plVar4[ubatch->n_tokens + sVar18] = plVar14[plVar3[sVar19 + sVar18]];
        sVar18 = sVar18 + 1;
      } while (length != sVar18);
    }
  }
  if (plVar2->embd == (float *)0x0) {
    pfVar11 = (float *)0x0;
LAB_001860b1:
    ubatch->embd = pfVar11;
  }
  else {
    if (bVar21 == false) {
      pfVar11 = plVar2->embd + seq->offset * this->n_embd;
      goto LAB_001860b1;
    }
    if (length != 0) {
      sVar19 = 0;
      do {
        sVar18 = this->n_embd;
        memcpy(ubatch->embd + (ubatch->n_tokens + sVar19) * sVar18,
               this->batch->embd +
               (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start[seq->offset + sVar19] * sVar18,sVar18 << 2);
        sVar19 = sVar19 + 1;
      } while (length != sVar19);
    }
  }
  bVar21 = ubatch->equal_seqs;
  if (bVar21 == true) {
    if (length != 0) {
      plVar5 = this->batch->pos;
      sVar19 = seq->offset;
      plVar3 = (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar6 = ubatch->pos;
      sVar18 = 0;
      do {
        plVar6[ubatch->n_tokens + sVar18] = plVar5[plVar3[sVar19 + sVar18]];
        sVar18 = sVar18 + 1;
      } while (length != sVar18);
    }
  }
  else {
    ubatch->pos = this->batch->pos + seq->offset;
  }
  if (bVar21 == false) {
    plVar2 = this->batch;
    piVar15 = plVar2->n_seq_id;
    if (piVar15 == (int32_t *)0x0) {
      if (length != 0) {
        piVar15 = ubatch->n_seq_id;
        sVar19 = length;
        do {
          piVar15[ubatch->n_seqs] = 1;
          piVar15 = piVar15 + 1;
          sVar19 = sVar19 - 1;
        } while (sVar19 != 0);
      }
    }
    else {
      ubatch->n_seq_id = piVar15 + seq->offset;
    }
    pplVar7 = plVar2->seq_id;
    if (pplVar7 != (llama_seq_id **)0x0) {
      ubatch->seq_id = pplVar7 + seq->offset;
    }
  }
  else {
    ubatch->n_seq_id[ubatch->n_seqs] = seq->n_seq_id;
    if (seq->seq_id != (llama_seq_id *)0x0) {
      ubatch->seq_id[ubatch->n_seqs] = seq->seq_id;
    }
  }
  if (this->logits_all == true) {
    if (length != 0) {
      local_38 = (vector<long,std::allocator<long>> *)&this->out_ids;
      lVar16 = 0;
      sVar19 = 0;
      do {
        ubatch->output[sVar19 + ubatch->n_tokens] = '\x01';
        plVar3 = (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar8._M_current =
             (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    (local_38,iVar8,(long *)((long)plVar3 + lVar16 + seq->offset * 8));
        }
        else {
          *iVar8._M_current = plVar3[seq->offset + sVar19];
          (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        sVar19 = sVar19 + 1;
        lVar16 = lVar16 + 8;
      } while (length != sVar19);
    }
  }
  else {
    piVar9 = this->batch->logits;
    if (piVar9 == (int8_t *)0x0) {
      if (length != 0) {
        sVar19 = 0;
        do {
          plVar3 = (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar16 = plVar3[seq->offset + sVar19];
          bVar21 = lVar16 == ((long)(this->ids).super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)plVar3 >> 3) +
                             -1;
          ubatch->output[sVar19 + ubatch->n_tokens] = bVar21;
          if (bVar21) {
            iVar8._M_current =
                 (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_40 = lVar16;
            if (iVar8._M_current ==
                (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (&this->out_ids,iVar8,&local_40);
            }
            else {
              *iVar8._M_current = lVar16;
              (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar8._M_current + 1;
            }
          }
          sVar19 = sVar19 + 1;
        } while (length != sVar19);
      }
    }
    else if (bVar21 == false) {
      ubatch->output = piVar9 + seq->offset;
      if (length != 0) {
        sVar19 = 0;
        do {
          if (ubatch->output[sVar19] != '\0') {
            local_40 = seq->offset + sVar19;
            iVar8._M_current =
                 (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (&this->out_ids,iVar8,&local_40);
            }
            else {
              *iVar8._M_current = local_40;
              (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar8._M_current + 1;
            }
          }
          sVar19 = sVar19 + 1;
        } while (length != sVar19);
      }
    }
    else if (length != 0) {
      sVar19 = 0;
      do {
        lVar16 = (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start[seq->offset + sVar19];
        cVar1 = this->batch->logits[lVar16];
        ubatch->output[sVar19 + ubatch->n_tokens] = cVar1;
        if (cVar1 != '\0') {
          iVar8._M_current =
               (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_40 = lVar16;
          if (iVar8._M_current ==
              (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&this->out_ids,iVar8,&local_40);
          }
          else {
            *iVar8._M_current = lVar16;
            (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar8._M_current + 1;
          }
        }
        sVar19 = sVar19 + 1;
      } while (length != sVar19);
    }
  }
  uVar20 = (uint32_t)length;
  if (ubatch->n_tokens == 0 && ubatch->n_seqs == 0) {
    uVar13 = 1;
    if (ubatch->equal_seqs != false) {
      uVar13 = uVar20;
    }
    ubatch->n_seq_tokens = uVar13;
  }
  uVar10 = ubatch->n_tokens + uVar20;
  ubatch->n_tokens = uVar10;
  uVar13 = 1;
  if (ubatch->equal_seqs == false) {
    uVar13 = uVar20;
  }
  uVar13 = uVar13 + ubatch->n_seqs;
  ubatch->n_seqs = uVar13;
  seq->offset = seq->offset + length;
  seq->length = seq->length - length;
  this->n_tokens = this->n_tokens - length;
  if (uVar10 == uVar13 * ubatch->n_seq_tokens) {
    return;
  }
  pcVar12 = "ubatch.n_tokens == ubatch.n_seq_tokens * ubatch.n_seqs";
  uVar17 = 0x89;
LAB_00186436:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
             ,uVar17,"GGML_ASSERT(%s) failed",pcVar12);
}

Assistant:

void llama_sbatch::add_seq_to_ubatch(llama_ubatch & ubatch, llama_sbatch_seq & seq, size_t length) {
    GGML_ASSERT(batch != nullptr);
    GGML_ASSERT(length <= seq.length);
    // Can only add sequences of equal lengths to a batch,
    // otherwise it isn't clear to which sequence a token belongs
    GGML_ASSERT(seq.n_seq_id == 0 || ubatch.n_seqs == 0 || length == (size_t) ubatch.n_tokens / ubatch.n_seqs);
    GGML_ASSERT((seq.n_seq_id != 0) == ubatch.equal_seqs);
    // NOTE: loops are separated for cache-friendliness
    if (batch->token) {
        if (ubatch.equal_seqs) {
            for (size_t i = 0; i < length; ++i) {
                ubatch.token[ubatch.n_tokens + i] = batch->token[ids[seq.offset + i]];
            }
        } else {
            // simple split
            ubatch.token = batch->token + seq.offset;
        }
    } else {
        ubatch.token = nullptr;
    }
    if (batch->embd) {
        if (ubatch.equal_seqs) {
            for (size_t i = 0; i < length; ++i) {
                memcpy(
                        ubatch.embd + (n_embd * (ubatch.n_tokens + i)),
                        batch->embd + (n_embd * ids[seq.offset + i]),
                        n_embd * sizeof(float)
                      );
            }
        } else {
            // simple split
            ubatch.embd = batch->embd + (n_embd * seq.offset);
        }
    } else {
        ubatch.embd = nullptr;
    }
    if (ubatch.equal_seqs) {
        for (size_t i = 0; i < length; ++i) {
            ubatch.pos[ubatch.n_tokens + i] = batch->pos[ids[seq.offset + i]];
        }
    } else {
        // simple split
        ubatch.pos = batch->pos + seq.offset;
    }
    if (ubatch.equal_seqs) {
        ubatch.n_seq_id[ubatch.n_seqs] = seq.n_seq_id;
        if (seq.seq_id) {
            ubatch.seq_id[ubatch.n_seqs] = seq.seq_id;
        }
    } else {
        // simple split
        if (batch->n_seq_id) {
            ubatch.n_seq_id = batch->n_seq_id + seq.offset;
        } else {
            for (size_t i = 0; i < length; ++i) {
                ubatch.n_seq_id[ubatch.n_seqs + i] = 1;
            }
        }
        if (batch->seq_id) {
            ubatch.seq_id = batch->seq_id + seq.offset;
        }
    }
    if (logits_all) {
        for (size_t i = 0; i < length; ++i) {
            ubatch.output[ubatch.n_tokens + i] = 1;
            out_ids.push_back(ids[seq.offset + i]);
        }
    } else if (batch->logits) {
        if (ubatch.equal_seqs) {
            for (size_t i = 0; i < length; ++i) {
                size_t id = ids[seq.offset + i];
                int8_t is_output = batch->logits[id];
                ubatch.output[ubatch.n_tokens + i] = is_output;
                if (is_output) { out_ids.push_back(id); }
            }
        } else {
            // simple split
            ubatch.output = batch->logits + seq.offset;
            for (size_t i = 0; i < length; ++i) {
                if (ubatch.output[i] != 0) { out_ids.push_back(seq.offset + i); }
            }
        }
    } else {
        // only get last output
        for (size_t i = 0; i < length; ++i) {
            size_t id = ids[seq.offset + i];
            int8_t is_last = id == ids.size() - 1;
            ubatch.output[ubatch.n_tokens + i] = is_last;
            if (is_last) { out_ids.push_back(id); }
        }
    }
    if (ubatch.n_tokens == 0 && ubatch.n_seqs == 0) {
        ubatch.n_seq_tokens = ubatch.equal_seqs ? length : 1;
    }
    ubatch.n_tokens += length;
    ubatch.n_seqs += ubatch.equal_seqs ? 1 : length; // virtual sequences for simple splits
    seq.offset += length;
    seq.length -= length;
    n_tokens -= length;
    GGML_ASSERT(ubatch.n_tokens == ubatch.n_seq_tokens * ubatch.n_seqs);
}